

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void CalcResizePosSizeFromAnyCorner
               (ImGuiWindow *window,ImVec2 *corner_target,ImVec2 *corner_norm,ImVec2 *out_pos,
               ImVec2 *out_size)

{
  ImVec2 *in_RCX;
  float *in_RDX;
  ImVec2 *in_R8;
  ImVec2 IVar1;
  ImVec2 IVar2;
  ImVec2 IVar3;
  ImVec2 *unaff_retaddr;
  ImVec2 size_constrained;
  ImVec2 size_expected;
  ImVec2 pos_max;
  ImVec2 pos_min;
  ImVec2 *in_stack_ffffffffffffffa8;
  ImVec2 *in_stack_ffffffffffffffb0;
  ImVec2 *in_stack_ffffffffffffffb8;
  
  IVar1 = ImLerp(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  operator+(in_stack_ffffffffffffffa8,(ImVec2 *)0x4bf5b0);
  ImLerp(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  IVar2 = operator-(in_stack_ffffffffffffffa8,(ImVec2 *)0x4bf5df);
  IVar3 = CalcWindowSizeAfterConstraint((ImGuiWindow *)size_constrained,unaff_retaddr);
  *in_RCX = IVar1;
  if ((*in_RDX == 0.0) && (!NAN(*in_RDX))) {
    in_RCX->x = in_RCX->x - (IVar3.x - IVar2.x);
  }
  if ((in_RDX[1] == 0.0) && (!NAN(in_RDX[1]))) {
    in_RCX->y = in_RCX->y - (IVar3.y - IVar2.y);
  }
  *in_R8 = IVar3;
  return;
}

Assistant:

static void CalcResizePosSizeFromAnyCorner(ImGuiWindow* window, const ImVec2& corner_target, const ImVec2& corner_norm, ImVec2* out_pos, ImVec2* out_size)
{
    ImVec2 pos_min = ImLerp(corner_target, window->Pos, corner_norm);                // Expected window upper-left
    ImVec2 pos_max = ImLerp(window->Pos + window->Size, corner_target, corner_norm); // Expected window lower-right
    ImVec2 size_expected = pos_max - pos_min;
    ImVec2 size_constrained = CalcWindowSizeAfterConstraint(window, size_expected);
    *out_pos = pos_min;
    if (corner_norm.x == 0.0f)
        out_pos->x -= (size_constrained.x - size_expected.x);
    if (corner_norm.y == 0.0f)
        out_pos->y -= (size_constrained.y - size_expected.y);
    *out_size = size_constrained;
}